

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3EvalSelectDeferred(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3TokenAndCost *aTC,int nTC)

{
  sqlite3_stmt sVar1;
  Fts3PhraseToken *pFVar2;
  sqlite3_stmt *psVar3;
  Fts3Cursor *pFVar4;
  Fts3Table *pTab;
  int iVar5;
  int iVar6;
  ulong uVar7;
  char *pBuf;
  Fts3TokenAndCost *pFVar8;
  Fts3DeferredToken *pFVar9;
  sqlite3_stmt *psVar10;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  char *pcVar14;
  uint uVar15;
  Fts3TokenAndCost *pFVar16;
  ulong uVar17;
  bool bVar18;
  int local_84;
  int nList;
  sqlite3_int64 nDoc;
  Fts3TokenAndCost *local_68;
  sqlite3_stmt *pStmt;
  ulong local_58;
  ulong local_50;
  uint local_44;
  Fts3Cursor *local_40;
  Fts3Table *local_38;
  
  local_38 = (Fts3Table *)(pCsr->base).pVtab;
  if (local_38->zContentTbl == (char *)0x0) {
    uVar7 = 0;
    uVar11 = (ulong)(uint)nTC;
    if (nTC < 1) {
      uVar11 = uVar7;
    }
    iVar12 = 0;
    uVar17 = 0;
    for (; iVar5 = (int)uVar17, uVar11 * 0x28 - uVar7 != 0; uVar7 = uVar7 + 0x28) {
      if (*(Fts3Expr **)((long)&aTC->pRoot + uVar7) == pRoot) {
        iVar12 = iVar12 + *(int *)((long)&aTC->nOvfl + uVar7);
        uVar17 = (ulong)(iVar5 + 1);
      }
    }
    if (1 < iVar5 && iVar12 != 0) {
      local_84 = pCsr->nRowAvg;
      local_58 = 0;
      iVar12 = 0;
      local_68 = aTC;
      local_40 = pCsr;
      if (local_84 == 0) {
        nDoc = 0;
        _nList = 0;
        iVar12 = sqlite3Fts3SelectDoctotal(local_38,&pStmt);
        psVar3 = pStmt;
        if (iVar12 == 0) {
          pBuf = (char *)sqlite3_column_blob(pStmt,0);
          iVar12 = sqlite3_column_bytes(psVar3,0);
          pcVar14 = pBuf + iVar12;
          iVar12 = sqlite3Fts3GetVarint(pBuf,&nDoc);
          while (pFVar4 = local_40, pBuf = pBuf + iVar12, pBuf < pcVar14) {
            iVar12 = sqlite3Fts3GetVarint(pBuf,(sqlite_int64 *)&nList);
          }
          if (_nList != 0 && nDoc != 0) {
            local_40->nDoc = nDoc;
            local_40->nRowAvg =
                 (int)(((long)_nList / nDoc + (long)local_38->nPgsz) / (long)local_38->nPgsz);
            iVar12 = sqlite3_reset(psVar3);
            local_84 = pFVar4->nRowAvg;
            aTC = local_68;
            goto LAB_001b9e3f;
          }
          sqlite3_reset(psVar3);
          iVar12 = 0x10b;
          aTC = local_68;
        }
        local_84 = 0;
      }
LAB_001b9e3f:
      local_44 = iVar5 - 1;
      iVar5 = 1;
      uVar13 = 0;
      local_50 = uVar17;
      do {
        pTab = local_38;
        if ((int)local_50 <= (int)uVar13) {
          return iVar12;
        }
        if (iVar12 != 0) {
          return iVar12;
        }
        pFVar16 = (Fts3TokenAndCost *)0x0;
        pFVar8 = aTC;
        uVar7 = uVar11;
        while (bVar18 = uVar7 != 0, uVar7 = uVar7 - 1, bVar18) {
          if (((pFVar8->pToken != (Fts3PhraseToken *)0x0) && (pFVar8->pRoot == pRoot)) &&
             ((pFVar16 == (Fts3TokenAndCost *)0x0 || (pFVar8->nOvfl < pFVar16->nOvfl)))) {
            pFVar16 = pFVar8;
          }
          pFVar8 = pFVar8 + 1;
        }
        if (uVar13 == 0) {
          iVar5 = iVar5 << 2;
LAB_001b9f12:
          _nList = _nList & 0xffffffff00000000;
          nDoc = 0;
          iVar12 = fts3TermSelect(local_38,pFVar16->pToken,pFVar16->iCol,&nList,(char **)&nDoc);
          if (iVar12 == 0) {
            iVar12 = fts3EvalPhraseMergeToken
                               (pTab,pFVar16->pPhrase,pFVar16->iToken,(char *)nDoc,nList);
            if (iVar12 == 0) {
              psVar3 = (sqlite3_stmt *)(pFVar16->pPhrase->doclist).aAll;
              iVar12 = 0;
              uVar15 = 0;
              if (psVar3 != (sqlite3_stmt *)0x0) {
                iVar6 = (pFVar16->pPhrase->doclist).nAll;
                uVar15 = 0;
                psVar10 = psVar3;
                while (psVar10 < psVar3 + iVar6) {
                  do {
                    sVar1 = *psVar10;
                    psVar10 = psVar10 + 1;
                  } while ((char)sVar1 < '\0');
                  uVar15 = uVar15 + 1;
                  pStmt = psVar10;
                  fts3PoslistCopy((char **)0x0,(char **)&pStmt);
                  psVar10 = pStmt;
                }
              }
              iVar6 = (int)local_58;
              local_58 = local_58 & 0xffffffff;
              if ((int)uVar15 < iVar6) {
                local_58 = (ulong)uVar15;
              }
              aTC = local_68;
              if (uVar13 == 0) {
                local_58 = (ulong)uVar15;
              }
            }
          }
        }
        else if (pFVar16->nOvfl < (((int)local_58 + iVar5 / 4 + -1) / (iVar5 / 4)) * local_84) {
          if (uVar13 < 0xc) {
            iVar5 = iVar5 * 4;
          }
          iVar12 = 0;
          if (uVar13 != local_44 && 1 < pFVar16->pPhrase->nToken) goto LAB_001b9f12;
        }
        else {
          pFVar2 = pFVar16->pToken;
          iVar6 = pFVar16->iCol;
          pFVar9 = (Fts3DeferredToken *)sqlite3_malloc(0x20);
          iVar12 = 7;
          if (pFVar9 != (Fts3DeferredToken *)0x0) {
            pFVar9->pList = (PendingList *)0x0;
            *(undefined8 *)&pFVar9->iCol = 0;
            pFVar9->pNext = (Fts3DeferredToken *)0x0;
            pFVar9->pToken = pFVar2;
            pFVar9->pNext = local_40->pDeferred;
            pFVar9->iCol = iVar6;
            local_40->pDeferred = pFVar9;
            pFVar2->pDeferred = pFVar9;
            iVar12 = 0;
          }
          fts3SegReaderCursorFree(pFVar2->pSegcsr);
          pFVar2->pSegcsr = (Fts3MultiSegReader *)0x0;
          aTC = local_68;
        }
        pFVar16->pToken = (Fts3PhraseToken *)0x0;
        uVar13 = uVar13 + 1;
      } while( true );
    }
  }
  return 0;
}

Assistant:

static int fts3EvalSelectDeferred(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Consider tokens with this root node */
  Fts3TokenAndCost *aTC,          /* Array of expression tokens and costs */
  int nTC                         /* Number of entries in aTC[] */
){
  Fts3Table *pTab = (Fts3Table *)pCsr->base.pVtab;
  int nDocSize = 0;               /* Number of pages per doc loaded */
  int rc = SQLITE_OK;             /* Return code */
  int ii;                         /* Iterator variable for various purposes */
  int nOvfl = 0;                  /* Total overflow pages used by doclists */
  int nToken = 0;                 /* Total number of tokens in cluster */

  int nMinEst = 0;                /* The minimum count for any phrase so far. */
  int nLoad4 = 1;                 /* (Phrases that will be loaded)^4. */

  /* Tokens are never deferred for FTS tables created using the content=xxx
  ** option. The reason being that it is not guaranteed that the content
  ** table actually contains the same data as the index. To prevent this from
  ** causing any problems, the deferred token optimization is completely
  ** disabled for content=xxx tables. */
  if( pTab->zContentTbl ){
    return SQLITE_OK;
  }

  /* Count the tokens in this AND/NEAR cluster. If none of the doclists
  ** associated with the tokens spill onto overflow pages, or if there is
  ** only 1 token, exit early. No tokens to defer in this case. */
  for(ii=0; ii<nTC; ii++){
    if( aTC[ii].pRoot==pRoot ){
      nOvfl += aTC[ii].nOvfl;
      nToken++;
    }
  }
  if( nOvfl==0 || nToken<2 ) return SQLITE_OK;

  /* Obtain the average docsize (in pages). */
  rc = fts3EvalAverageDocsize(pCsr, &nDocSize);
  assert( rc!=SQLITE_OK || nDocSize>0 );


  /* Iterate through all tokens in this AND/NEAR cluster, in ascending order 
  ** of the number of overflow pages that will be loaded by the pager layer 
  ** to retrieve the entire doclist for the token from the full-text index.
  ** Load the doclists for tokens that are either:
  **
  **   a. The cheapest token in the entire query (i.e. the one visited by the
  **      first iteration of this loop), or
  **
  **   b. Part of a multi-token phrase.
  **
  ** After each token doclist is loaded, merge it with the others from the
  ** same phrase and count the number of documents that the merged doclist
  ** contains. Set variable "nMinEst" to the smallest number of documents in 
  ** any phrase doclist for which 1 or more token doclists have been loaded.
  ** Let nOther be the number of other phrases for which it is certain that
  ** one or more tokens will not be deferred.
  **
  ** Then, for each token, defer it if loading the doclist would result in
  ** loading N or more overflow pages into memory, where N is computed as:
  **
  **    (nMinEst + 4^nOther - 1) / (4^nOther)
  */
  for(ii=0; ii<nToken && rc==SQLITE_OK; ii++){
    int iTC;                      /* Used to iterate through aTC[] array. */
    Fts3TokenAndCost *pTC = 0;    /* Set to cheapest remaining token. */

    /* Set pTC to point to the cheapest remaining token. */
    for(iTC=0; iTC<nTC; iTC++){
      if( aTC[iTC].pToken && aTC[iTC].pRoot==pRoot 
       && (!pTC || aTC[iTC].nOvfl<pTC->nOvfl) 
      ){
        pTC = &aTC[iTC];
      }
    }
    assert( pTC );

    if( ii && pTC->nOvfl>=((nMinEst+(nLoad4/4)-1)/(nLoad4/4))*nDocSize ){
      /* The number of overflow pages to load for this (and therefore all
      ** subsequent) tokens is greater than the estimated number of pages 
      ** that will be loaded if all subsequent tokens are deferred.
      */
      Fts3PhraseToken *pToken = pTC->pToken;
      rc = sqlite3Fts3DeferToken(pCsr, pToken, pTC->iCol);
      fts3SegReaderCursorFree(pToken->pSegcsr);
      pToken->pSegcsr = 0;
    }else{
      /* Set nLoad4 to the value of (4^nOther) for the next iteration of the
      ** for-loop. Except, limit the value to 2^24 to prevent it from 
      ** overflowing the 32-bit integer it is stored in. */
      if( ii<12 ) nLoad4 = nLoad4*4;

      if( ii==0 || (pTC->pPhrase->nToken>1 && ii!=nToken-1) ){
        /* Either this is the cheapest token in the entire query, or it is
        ** part of a multi-token phrase. Either way, the entire doclist will
        ** (eventually) be loaded into memory. It may as well be now. */
        Fts3PhraseToken *pToken = pTC->pToken;
        int nList = 0;
        char *pList = 0;
        rc = fts3TermSelect(pTab, pToken, pTC->iCol, &nList, &pList);
        assert( rc==SQLITE_OK || pList==0 );
        if( rc==SQLITE_OK ){
          rc = fts3EvalPhraseMergeToken(
              pTab, pTC->pPhrase, pTC->iToken,pList,nList
          );
        }
        if( rc==SQLITE_OK ){
          int nCount;
          nCount = fts3DoclistCountDocids(
              pTC->pPhrase->doclist.aAll, pTC->pPhrase->doclist.nAll
          );
          if( ii==0 || nCount<nMinEst ) nMinEst = nCount;
        }
      }
    }
    pTC->pToken = 0;
  }

  return rc;
}